

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set.hpp
# Opt level: O0

bool __thiscall Lib::Set<Kernel::Term_*,_Lib::DefaultHash>::Iterator::hasNext(Iterator *this)

{
  bool bVar1;
  long *in_RDI;
  
  while( true ) {
    if (*in_RDI == in_RDI[1]) {
      return false;
    }
    bVar1 = Set<Kernel::Term_*,_Lib::DefaultHash>::Cell::occupied((Cell *)*in_RDI);
    if (bVar1) break;
    *in_RDI = *in_RDI + 0x10;
  }
  return true;
}

Assistant:

bool hasNext()
    {
      while (_next != _last) {
	if (_next->occupied()) {
	  return true;
	}
	_next++;
      }
      return false;
    }